

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * EvaluateCast(ExpressionEvalContext *ctx,ExprTypeCast *expression)

{
  TypeBase *pTVar1;
  SynBase *pSVar2;
  longlong el0;
  ExprTypeCast *pEVar3;
  bool bVar4;
  uint uVar5;
  ExprRationalLiteral *pEVar6;
  ExprBase *value_00;
  TypeArray *pTVar7;
  TypeClass *pTVar8;
  TypeUnsizedArray *pTVar9;
  ExprTypeLiteral *pEVar10;
  ExprIntegerLiteral *pEVar11;
  ExprBase *pEVar12;
  TypeRef *pTVar13;
  ExprBase *pEVar14;
  ExprPointerLiteral *pEVar15;
  ExprPointerLiteral *pEVar16;
  ExprMemoryLiteral *pEVar17;
  ExprMemoryLiteral *this;
  ExprFunctionLiteral *pEVar18;
  ExprFunctionLiteral *this_00;
  ExprIntegerLiteral *pEVar19;
  ExprIntegerLiteral *intLiteral_1;
  ExprIntegerLiteral *intLiteral;
  ExprFunctionLiteral *funcLiteral_1;
  ExprMemoryLiteral *memLiteral_3;
  ExprPointerLiteral *tmp;
  TypeRef *refType_3;
  uint index;
  ExprTypeLiteral *typeLiteral;
  ExprBase *result_8;
  ExprBase *length_1;
  ExprBase *ptr_6;
  ExprBase *typeId_4;
  ExprMemoryLiteral *memLiteral_2;
  TypeUnsizedArray *arrType_1;
  ExprBase *ptr_5;
  ExprTypeLiteral *typeId_3;
  ExprMemoryLiteral *memLiteral_1;
  TypeRef *refType_2;
  ExprBase *result_7;
  ExprPointerLiteral *ptr_4;
  ExprBase *typeId_2;
  TypeClass *classType;
  TypeRef *refType_1;
  ExprBase *result_6;
  TypeArray *arrType;
  TypeRef *refType;
  ExprFunctionLiteral *result_5;
  ExprBase *context;
  ExprBase *result_4;
  ExprBase *length;
  ExprBase *ptr_3;
  ExprBase *typeId_1;
  ExprBase *result_3;
  ExprBase *size;
  ExprBase *ptr_2;
  ExprBase *result_2;
  ExprBase *ptr_1;
  ExprBase *typeId;
  ExprFunctionLiteral *funcLiteral;
  ExprBase *ptr;
  ExprMemoryLiteral *memLiteral;
  double result_1;
  ExprRationalLiteral *expr;
  longlong result;
  ExprBase *value;
  ExprTypeCast *expression_local;
  ExpressionEvalContext *ctx_local;
  
  value = &expression->super_ExprBase;
  expression_local = (ExprTypeCast *)ctx;
  bVar4 = AddInstruction(ctx);
  if (!bVar4) {
    return (ExprBase *)0x0;
  }
  result = (longlong)
           Evaluate((ExpressionEvalContext *)expression_local,(ExprBase *)value[1]._vptr_ExprBase);
  pEVar12 = value;
  if ((ExprBase *)result == (ExprBase *)0x0) {
    return (ExprBase *)0x0;
  }
  switch(value[1].typeID) {
  case 0:
    bVar4 = ExpressionContext::IsIntegerType
                      ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                       value->type);
    if (bVar4) {
      expr = (ExprRationalLiteral *)0x0;
      result_1 = (double)getType<ExprRationalLiteral>((ExprBase *)result);
      pEVar12 = value;
      if ((ExprRationalLiteral *)result_1 == (ExprRationalLiteral *)0x0) {
        bVar4 = TryTakeLong((ExprBase *)result,(longlong *)&expr);
        pEVar12 = value;
        if (bVar4) {
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138])
          {
            pEVar14 = &ExpressionContext::get<ExprBoolLiteral>
                                 ((ExpressionContext *)
                                  (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase
            ;
            ExprBoolLiteral::ExprBoolLiteral
                      ((ExprBoolLiteral *)pEVar14,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138],
                       expr != (ExprRationalLiteral *)0x0);
            pEVar12 = CheckType(pEVar12,pEVar14);
            return pEVar12;
          }
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1139])
          {
            pEVar14 = &ExpressionContext::get<ExprCharacterLiteral>
                                 ((ExpressionContext *)
                                  (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase
            ;
            ExprCharacterLiteral::ExprCharacterLiteral
                      ((ExprCharacterLiteral *)pEVar14,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1139],
                       (char)expr);
            pEVar12 = CheckType(pEVar12,pEVar14);
            return pEVar12;
          }
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113a])
          {
            pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                                ((ExpressionContext *)
                                 (expression_local->super_ExprBase)._vptr_ExprBase);
            ExprIntegerLiteral::ExprIntegerLiteral
                      (pEVar11,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113a],
                       (long)(short)expr);
            pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
            return pEVar12;
          }
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b])
          {
            pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                                ((ExpressionContext *)
                                 (expression_local->super_ExprBase)._vptr_ExprBase);
            ExprIntegerLiteral::ExprIntegerLiteral
                      (pEVar11,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b],
                       (long)(int)expr);
            pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
            return pEVar12;
          }
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113c])
          {
            pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                                ((ExpressionContext *)
                                 (expression_local->super_ExprBase)._vptr_ExprBase);
            ExprIntegerLiteral::ExprIntegerLiteral
                      (pEVar11,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113c],
                       (longlong)expr);
            pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
            return pEVar12;
          }
        }
      }
      else {
        if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138]) {
          pEVar14 = &ExpressionContext::get<ExprBoolLiteral>
                               ((ExpressionContext *)
                                (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase;
          ExprBoolLiteral::ExprBoolLiteral
                    ((ExprBoolLiteral *)pEVar14,value->source,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138],
                     *(double *)((long)result_1 + 0x30) != 0.0);
          pEVar12 = CheckType(pEVar12,pEVar14);
          return pEVar12;
        }
        if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1139]) {
          pEVar14 = &ExpressionContext::get<ExprCharacterLiteral>
                               ((ExpressionContext *)
                                (expression_local->super_ExprBase)._vptr_ExprBase)->super_ExprBase;
          ExprCharacterLiteral::ExprCharacterLiteral
                    ((ExprCharacterLiteral *)pEVar14,value->source,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1139],
                     (char)(int)*(double *)((long)result_1 + 0x30));
          pEVar12 = CheckType(pEVar12,pEVar14);
          return pEVar12;
        }
        if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113a]) {
          pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                              ((ExpressionContext *)
                               (expression_local->super_ExprBase)._vptr_ExprBase);
          ExprIntegerLiteral::ExprIntegerLiteral
                    (pEVar11,value->source,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113a],
                     (long)(short)(int)*(double *)((long)result_1 + 0x30));
          pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
          return pEVar12;
        }
        if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b]) {
          pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                              ((ExpressionContext *)
                               (expression_local->super_ExprBase)._vptr_ExprBase);
          ExprIntegerLiteral::ExprIntegerLiteral
                    (pEVar11,value->source,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b],
                     (long)(int)*(double *)((long)result_1 + 0x30));
          pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
          return pEVar12;
        }
        if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113c]) {
          pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                              ((ExpressionContext *)
                               (expression_local->super_ExprBase)._vptr_ExprBase);
          ExprIntegerLiteral::ExprIntegerLiteral
                    (pEVar11,value->source,
                     (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113c],
                     (long)*(double *)((long)result_1 + 0x30));
          pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
          return pEVar12;
        }
      }
    }
    else {
      bVar4 = ExpressionContext::IsFloatingPointType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         value->type);
      if (bVar4) {
        memLiteral = (ExprMemoryLiteral *)0x0;
        bVar4 = TryTakeDouble((ExprBase *)result,(double *)&memLiteral);
        pEVar12 = value;
        if (bVar4) {
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113d])
          {
            pEVar6 = ExpressionContext::get<ExprRationalLiteral>
                               ((ExpressionContext *)
                                (expression_local->super_ExprBase)._vptr_ExprBase);
            ExprRationalLiteral::ExprRationalLiteral
                      (pEVar6,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113d],
                       (double)(float)(double)memLiteral);
            pEVar12 = CheckType(pEVar12,&pEVar6->super_ExprBase);
            return pEVar12;
          }
          if (value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113e])
          {
            pEVar6 = ExpressionContext::get<ExprRationalLiteral>
                               ((ExpressionContext *)
                                (expression_local->super_ExprBase)._vptr_ExprBase);
            ExprRationalLiteral::ExprRationalLiteral
                      (pEVar6,value->source,
                       (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113e],
                       (double)memLiteral);
            pEVar12 = CheckType(pEVar12,&pEVar6->super_ExprBase);
            return pEVar12;
          }
        }
      }
    }
  default:
switchD_00187613_default:
    ctx_local = (ExpressionEvalContext *)
                Report((ExpressionEvalContext *)expression_local,
                       "ERROR: failed to cast \'%.*s\' to \'%.*s\'",
                       (ulong)(uint)((int)*(undefined8 *)(*(long *)(result + 0x18) + 0x18) -
                                    (int)*(undefined8 *)(*(long *)(result + 0x18) + 0x10)),
                       *(undefined8 *)(*(long *)(result + 0x18) + 0x10),
                       (ulong)(uint)((int)(value->type->name).end - (int)(value->type->name).begin),
                       (value->type->name).begin);
    break;
  case 1:
    pEVar14 = &ExpressionContext::get<ExprBoolLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    pSVar2 = value->source;
    pTVar1 = (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138];
    bVar4 = isType<ExprNullptrLiteral>((ExprBase *)result);
    ExprBoolLiteral::ExprBoolLiteral
              ((ExprBoolLiteral *)pEVar14,pSVar2,pTVar1,(bool)((bVar4 ^ 0xffU) & 1));
    ctx_local = (ExpressionEvalContext *)CheckType(pEVar12,pEVar14);
    break;
  case 2:
    pEVar17 = getType<ExprMemoryLiteral>((ExprBase *)result);
    pEVar3 = expression_local;
    pTVar13 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    pEVar14 = CreateExtract((ExpressionEvalContext *)pEVar3,pEVar17,0,&pTVar13->super_TypeBase);
    pEVar12 = value;
    value_00 = &ExpressionContext::get<ExprBoolLiteral>
                          ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
                super_ExprBase;
    pSVar2 = value->source;
    pTVar1 = (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138];
    bVar4 = isType<ExprNullptrLiteral>(pEVar14);
    ExprBoolLiteral::ExprBoolLiteral
              ((ExprBoolLiteral *)value_00,pSVar2,pTVar1,(bool)((bVar4 ^ 0xffU) & 1));
    ctx_local = (ExpressionEvalContext *)CheckType(pEVar12,value_00);
    break;
  case 3:
    pEVar18 = getType<ExprFunctionLiteral>((ExprBase *)result);
    pEVar12 = value;
    pEVar14 = &ExpressionContext::get<ExprBoolLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    ExprBoolLiteral::ExprBoolLiteral
              ((ExprBoolLiteral *)pEVar14,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1138],
               pEVar18->data != (FunctionData *)0x0);
    ctx_local = (ExpressionEvalContext *)CheckType(pEVar12,pEVar14);
    break;
  case 4:
    pEVar14 = &ExpressionContext::get<ExprNullptrLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    ExprNullptrLiteral::ExprNullptrLiteral((ExprNullptrLiteral *)pEVar14,value->source,value->type);
    ctx_local = (ExpressionEvalContext *)CheckType(pEVar12,pEVar14);
    break;
  case 5:
    pEVar10 = ExpressionContext::get<ExprTypeLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprTypeLiteral::ExprTypeLiteral
              (pEVar10,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f],
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    pEVar12 = &ExpressionContext::get<ExprNullptrLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    pSVar2 = value->source;
    pTVar13 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    ExprNullptrLiteral::ExprNullptrLiteral
              ((ExprNullptrLiteral *)pEVar12,pSVar2,&pTVar13->super_TypeBase);
    pEVar17 = CreateConstruct((ExpressionEvalContext *)expression_local,value->type,
                              &pEVar10->super_ExprBase,pEVar12,(ExprBase *)0x0);
    if (pEVar17 == (ExprMemoryLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar17->super_ExprBase);
    }
    break;
  case 6:
    pEVar12 = &ExpressionContext::get<ExprNullptrLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    pSVar2 = value->source;
    pTVar13 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    ExprNullptrLiteral::ExprNullptrLiteral
              ((ExprNullptrLiteral *)pEVar12,pSVar2,&pTVar13->super_TypeBase);
    pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprIntegerLiteral::ExprIntegerLiteral
              (pEVar11,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b],0);
    pEVar17 = CreateConstruct((ExpressionEvalContext *)expression_local,value->type,pEVar12,
                              &pEVar11->super_ExprBase,(ExprBase *)0x0);
    if (pEVar17 == (ExprMemoryLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar17->super_ExprBase);
    }
    break;
  case 7:
    pEVar10 = ExpressionContext::get<ExprTypeLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprTypeLiteral::ExprTypeLiteral
              (pEVar10,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f],
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    pEVar12 = &ExpressionContext::get<ExprNullptrLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    pSVar2 = value->source;
    pTVar13 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    ExprNullptrLiteral::ExprNullptrLiteral
              ((ExprNullptrLiteral *)pEVar12,pSVar2,&pTVar13->super_TypeBase);
    pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprIntegerLiteral::ExprIntegerLiteral
              (pEVar11,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b],0);
    pEVar17 = CreateConstruct((ExpressionEvalContext *)expression_local,value->type,
                              &pEVar10->super_ExprBase,pEVar12,&pEVar11->super_ExprBase);
    if (pEVar17 == (ExprMemoryLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar17->super_ExprBase);
    }
    break;
  case 8:
    pEVar12 = &ExpressionContext::get<ExprNullptrLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)->
               super_ExprBase;
    pSVar2 = value->source;
    pTVar13 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    ExprNullptrLiteral::ExprNullptrLiteral
              ((ExprNullptrLiteral *)pEVar12,pSVar2,&pTVar13->super_TypeBase);
    pEVar18 = ExpressionContext::get<ExprFunctionLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprFunctionLiteral::ExprFunctionLiteral
              (pEVar18,value->source,value->type,(FunctionData *)0x0,pEVar12);
    ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar18->super_ExprBase);
    break;
  case 9:
    pTVar13 = getType<TypeRef>(((ExprBase *)result)->type);
    if (pTVar13 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4b9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pTVar7 = getType<TypeArray>(pTVar13->subType);
    pEVar3 = expression_local;
    el0 = result;
    if (pTVar7 == (TypeArray *)0x0) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4bd,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    if ((pTVar7->length & 0xffffffffU) != pTVar7->length) {
      __assert_fail("unsigned(arrType->length) == arrType->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4be,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pTVar1 = value->type;
    pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprIntegerLiteral::ExprIntegerLiteral
              (pEVar11,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b],pTVar7->length)
    ;
    pEVar17 = CreateConstruct((ExpressionEvalContext *)pEVar3,pTVar1,(ExprBase *)el0,
                              &pEVar11->super_ExprBase,(ExprBase *)0x0);
    if (pEVar17 == (ExprMemoryLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar17->super_ExprBase);
    }
    break;
  case 10:
    pTVar13 = getType<TypeRef>(((ExprBase *)result)->type);
    if (pTVar13 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4cc,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pTVar8 = getType<TypeClass>(pTVar13->subType);
    if ((pTVar8 == (TypeClass *)0x0) ||
       (((pTVar8->extendable & 1U) == 0 && (pTVar8->baseClass == (TypeClass *)0x0)))) {
      ptr_4 = (ExprPointerLiteral *)
              ExpressionContext::get<ExprTypeLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
      ExprTypeLiteral::ExprTypeLiteral
                ((ExprTypeLiteral *)ptr_4,value->source,
                 (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f],
                 pTVar13->subType);
    }
    else {
      bVar4 = isType<ExprNullptrLiteral>((ExprBase *)result);
      if (bVar4) {
        pEVar12 = Report((ExpressionEvalContext *)expression_local,"ERROR: null pointer access");
        return pEVar12;
      }
      pEVar15 = getType<ExprPointerLiteral>((ExprBase *)result);
      pEVar3 = expression_local;
      if (pEVar15 == (ExprPointerLiteral *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4d9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      if ((long)pEVar15->end - (long)pEVar15->ptr < 4) {
        __assert_fail("ptr->end - ptr->ptr >= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4da,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      pEVar16 = ExpressionContext::get<ExprPointerLiteral>
                          ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
      pSVar2 = value->source;
      pTVar13 = ExpressionContext::GetReferenceType
                          ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                           (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f]);
      ExprPointerLiteral::ExprPointerLiteral
                (pEVar16,pSVar2,&pTVar13->super_TypeBase,pEVar15->ptr,pEVar15->ptr + 4);
      ptr_4 = (ExprPointerLiteral *)
              CreateLoad((ExpressionEvalContext *)pEVar3,&pEVar16->super_ExprBase);
    }
    pEVar17 = CreateConstruct((ExpressionEvalContext *)expression_local,value->type,
                              &ptr_4->super_ExprBase,(ExprBase *)result,(ExprBase *)0x0);
    if (pEVar17 == (ExprMemoryLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar17->super_ExprBase);
    }
    break;
  case 0xb:
    pTVar13 = getType<TypeRef>(value->type);
    if (pTVar13 == (TypeRef *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4ef,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar17 = getType<ExprMemoryLiteral>((ExprBase *)result);
    pEVar12 = CreateExtract((ExpressionEvalContext *)expression_local,pEVar17,0,
                            (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f]);
    pEVar10 = getType<ExprTypeLiteral>(pEVar12);
    if (pEVar10->value == pTVar13->subType) {
      pEVar12 = CreateExtract((ExpressionEvalContext *)expression_local,pEVar17,4,
                              &pTVar13->super_TypeBase);
      if (pEVar12 == (ExprBase *)0x0) {
        ctx_local = (ExpressionEvalContext *)0x0;
      }
      else {
        ctx_local = (ExpressionEvalContext *)CheckType(value,pEVar12);
      }
    }
    else {
      ctx_local = (ExpressionEvalContext *)
                  Report((ExpressionEvalContext *)expression_local,
                         "ERROR: failed to cast \'%.*s\' to \'%.*s\'",
                         (ulong)(uint)((int)*(undefined8 *)(*(long *)(result + 0x18) + 0x18) -
                                      (int)*(undefined8 *)(*(long *)(result + 0x18) + 0x10)),
                         *(undefined8 *)(*(long *)(result + 0x18) + 0x10),
                         (ulong)(uint)((int)(value->type->name).end - (int)(value->type->name).begin
                                      ),(value->type->name).begin);
    }
    break;
  case 0xc:
    pTVar9 = getType<TypeUnsizedArray>(((ExprBase *)result)->type);
    if (pTVar9 == (TypeUnsizedArray *)0x0) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x504,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar17 = getType<ExprMemoryLiteral>((ExprBase *)result);
    pEVar10 = ExpressionContext::get<ExprTypeLiteral>
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
    ExprTypeLiteral::ExprTypeLiteral
              (pEVar10,value->source,
               (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f],pTVar9->subType
              );
    pEVar3 = expression_local;
    pTVar13 = ExpressionContext::GetReferenceType
                        ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                         (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x1137]);
    pEVar12 = CreateExtract((ExpressionEvalContext *)pEVar3,pEVar17,0,&pTVar13->super_TypeBase);
    pEVar14 = CreateExtract((ExpressionEvalContext *)expression_local,pEVar17,8,
                            (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b]);
    pEVar17 = CreateConstruct((ExpressionEvalContext *)expression_local,value->type,
                              &pEVar10->super_ExprBase,pEVar12,pEVar14);
    if (pEVar17 == (ExprMemoryLiteral *)0x0) {
      ctx_local = (ExpressionEvalContext *)0x0;
    }
    else {
      ctx_local = (ExpressionEvalContext *)CheckType(value,&pEVar17->super_ExprBase);
    }
    break;
  case 0xd:
    if ((value->type == (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b]) &&
       (((ExprBase *)result)->type ==
        (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113f])) {
      pEVar10 = getType<ExprTypeLiteral>((ExprBase *)result);
      bVar4 = isType<TypeError>(pEVar10->value);
      if (bVar4) {
        return (ExprBase *)0x0;
      }
      bVar4 = isType<TypeArgumentSet>(pEVar10->value);
      if ((!bVar4) && (bVar4 = isType<TypeMemberSet>(pEVar10->value), !bVar4)) {
        uVar5 = ExpressionContext::GetTypeIndex
                          ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase,
                           pEVar10->value);
        pEVar12 = value;
        pEVar11 = ExpressionContext::get<ExprIntegerLiteral>
                            ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)
        ;
        ExprIntegerLiteral::ExprIntegerLiteral
                  (pEVar11,value->source,
                   (TypeBase *)(expression_local->super_ExprBase)._vptr_ExprBase[0x113b],
                   (ulong)uVar5);
        pEVar12 = CheckType(pEVar12,&pEVar11->super_ExprBase);
        return pEVar12;
      }
      return (ExprBase *)0x0;
    }
    bVar4 = isType<TypeRef>(value->type);
    if ((bVar4) && (bVar4 = isType<TypeRef>(*(TypeBase **)(result + 0x18)), bVar4)) {
      pTVar13 = getType<TypeRef>(value->type);
      bVar4 = isType<ExprNullptrLiteral>((ExprBase *)result);
      pEVar12 = value;
      if (bVar4) {
        pEVar14 = &ExpressionContext::get<ExprNullptrLiteral>
                             ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase
                             )->super_ExprBase;
        ExprNullptrLiteral::ExprNullptrLiteral
                  ((ExprNullptrLiteral *)pEVar14,value->source,value->type);
        pEVar12 = CheckType(pEVar12,pEVar14);
        return pEVar12;
      }
      pEVar15 = getType<ExprPointerLiteral>((ExprBase *)result);
      pEVar12 = value;
      if (pEVar15 != (ExprPointerLiteral *)0x0) {
        if ((ulong)pTVar13->subType->size <= (ulong)((long)pEVar15->end - (long)pEVar15->ptr)) {
          pEVar16 = ExpressionContext::get<ExprPointerLiteral>
                              ((ExpressionContext *)
                               (expression_local->super_ExprBase)._vptr_ExprBase);
          ExprPointerLiteral::ExprPointerLiteral
                    (pEVar16,value->source,value->type,pEVar15->ptr,pEVar15->end);
          pEVar12 = CheckType(pEVar12,&pEVar16->super_ExprBase);
          return pEVar12;
        }
        __assert_fail("uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x52d,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
    }
    else {
      bVar4 = isType<TypeUnsizedArray>(value->type);
      if ((bVar4) && (bVar4 = isType<TypeUnsizedArray>(*(TypeBase **)(result + 0x18)), bVar4)) {
        pEVar17 = getType<ExprMemoryLiteral>((ExprBase *)result);
        pEVar12 = value;
        this = ExpressionContext::get<ExprMemoryLiteral>
                         ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase);
        ExprMemoryLiteral::ExprMemoryLiteral(this,value->source,value->type,pEVar17->ptr);
        pEVar12 = CheckType(pEVar12,&this->super_ExprBase);
        return pEVar12;
      }
      bVar4 = isType<TypeFunction>(value->type);
      if ((bVar4) && (bVar4 = isType<TypeFunction>(*(TypeBase **)(result + 0x18)), bVar4)) {
        pEVar18 = getType<ExprFunctionLiteral>((ExprBase *)result);
        pEVar12 = value;
        this_00 = ExpressionContext::get<ExprFunctionLiteral>
                            ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)
        ;
        ExprFunctionLiteral::ExprFunctionLiteral
                  (this_00,value->source,value->type,pEVar18->data,pEVar18->context);
        pEVar12 = CheckType(pEVar12,&this_00->super_ExprBase);
        return pEVar12;
      }
      bVar4 = isType<TypeInt>(value->type);
      if ((bVar4) && (bVar4 = isType<TypeEnum>(*(TypeBase **)(result + 0x18)), bVar4)) {
        pEVar11 = getType<ExprIntegerLiteral>((ExprBase *)result);
        pEVar12 = value;
        pEVar19 = ExpressionContext::get<ExprIntegerLiteral>
                            ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)
        ;
        ExprIntegerLiteral::ExprIntegerLiteral(pEVar19,value->source,value->type,pEVar11->value);
        pEVar12 = CheckType(pEVar12,&pEVar19->super_ExprBase);
        return pEVar12;
      }
      bVar4 = isType<TypeEnum>(value->type);
      if ((bVar4) && (bVar4 = isType<TypeInt>(*(TypeBase **)(result + 0x18)), bVar4)) {
        pEVar11 = getType<ExprIntegerLiteral>((ExprBase *)result);
        pEVar12 = value;
        pEVar19 = ExpressionContext::get<ExprIntegerLiteral>
                            ((ExpressionContext *)(expression_local->super_ExprBase)._vptr_ExprBase)
        ;
        ExprIntegerLiteral::ExprIntegerLiteral(pEVar19,value->source,value->type,pEVar11->value);
        pEVar12 = CheckType(pEVar12,&pEVar19->super_ExprBase);
        return pEVar12;
      }
    }
    goto switchD_00187613_default;
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* EvaluateCast(ExpressionEvalContext &ctx, ExprTypeCast *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	switch(expression->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(ctx.ctx.IsIntegerType(expression->type))
		{
			long long result = 0;

			if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, expr->value != 0.0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)expr->value));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)expr->value));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)expr->value));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, (long long)expr->value));
			}
			else if(TryTakeLong(value, result))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, result != 0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)result));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)result));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)result));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, result));
			}
		}
		else if(ctx.ctx.IsFloatingPointType(expression->type))
		{
			double result = 0.0;

			if(TryTakeDouble(value, result))
			{
				if(expression->type == ctx.ctx.typeFloat)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeFloat, (float)result));

				if(expression->type == ctx.ctx.typeDouble)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeDouble, result));
			}
		}
		break;
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(value)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(ptr)));
		}
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, funcLiteral->data != NULL));
		}
		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_UNSIZED:
		{
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *size = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, ptr, size, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_FUNCTION:
		{
			ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprFunctionLiteral *result = new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, NULL, context);

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			ExprBase *result = CreateConstruct(ctx, expression->type, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, arrType->length), NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeClass *classType = getType<TypeClass>(refType->subType);

			ExprBase *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
			{
				if(isType<ExprNullptrLiteral>(value))
					return Report(ctx, "ERROR: null pointer access");

				ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

				assert(ptr);
				assert(ptr->end - ptr->ptr >= 4);

				typeId = CreateLoad(ctx, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeTypeID), ptr->ptr, ptr->ptr + 4));
			}
			else
			{
				typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, refType->subType);
			}

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, value, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			assert(refType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprTypeLiteral *typeId = getType<ExprTypeLiteral>(CreateExtract(ctx, memLiteral, 0, ctx.ctx.typeTypeID));

			if(typeId->value != refType->subType)
				return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 4, refType);

			if(!ptr)
				return NULL;

			return CheckType(expression, ptr);
		}
		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		{
			TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(value->type);

			assert(arrType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, arrType->subType);
			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = CreateExtract(ctx, memLiteral, sizeof(void*), ctx.ctx.typeInt);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_REINTERPRET:
		if(expression->type == ctx.ctx.typeInt && value->type == ctx.ctx.typeTypeID)
		{
			ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value);

			if(isType<TypeError>(typeLiteral->value))
				return NULL;

			if(isType<TypeArgumentSet>(typeLiteral->value) || isType<TypeMemberSet>(typeLiteral->value))
				return NULL;

			unsigned index = ctx.ctx.GetTypeIndex(typeLiteral->value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, index));
		}
		else if(isType<TypeRef>(expression->type) && isType<TypeRef>(value->type))
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			if(isType<ExprNullptrLiteral>(value))
				return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
			
			if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			{
				(void)refType;
				assert(uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size));

				return CheckType(expression, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, expression->type, tmp->ptr, tmp->end));
			}
		}
		else if(isType<TypeUnsizedArray>(expression->type) && isType<TypeUnsizedArray>(value->type))
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprMemoryLiteral>()) ExprMemoryLiteral(expression->source, expression->type, memLiteral->ptr));
		}
		else if(isType<TypeFunction>(expression->type) && isType<TypeFunction>(value->type))
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, funcLiteral->data, funcLiteral->context));
		}
		else if(isType<TypeInt>(expression->type) && isType<TypeEnum>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		else if(isType<TypeEnum>(expression->type) && isType<TypeInt>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		break;
	}

	return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));
}